

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Recoil(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *this;
  DAngle local_20;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003e2d9e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e2d9e;
        }
        goto LAB_003e2d51;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_003e2d8e;
    this = (AActor *)0x0;
LAB_003e2d51:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        local_20.Degrees = (this->Angles).Yaw.Degrees + 180.0;
        AActor::Thrust(this,&local_20,param[1].field_0.f);
        return 0;
      }
      pcVar2 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc02,
                  "int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003e2d8e:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003e2d9e:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc01,"int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Recoil)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(xyvel);

	self->Thrust(self->Angles.Yaw + 180., xyvel);
	return 0;
}